

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O0

void __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::apply
          (iSWAP<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int qubit0;
  reference pvVar2;
  uint *puVar3;
  complex<double> *pcVar4;
  complex<double> *vector_00;
  undefined1 local_58 [8];
  anon_class_24_2_357f297d f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  iSWAP<std::complex<double>_> *this_local;
  
  pvVar1 = (vector<int,_std::allocator<int>_> *)(f.lambda._M_value + 8);
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])();
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,0);
  *pvVar2 = *pvVar2 + offset;
  puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar1,1);
  vector_00 = (complex<double> *)(ulong)(*puVar3 + offset);
  *puVar3 = *puVar3 + offset;
  pcVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data(vector);
  lambda_iSWAP<std::complex<double>>
            ((anon_class_24_2_357f297d *)local_58,(qgates *)(ulong)(uint)(int)(char)op,(Op)pcVar4,
             vector_00);
  pvVar1 = (vector<int,_std::allocator<int>_> *)(f.lambda._M_value + 8);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,0);
  qubit0 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,1);
  apply4bc<qclab::qgates::lambda_iSWAP<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,qubit0,*pvVar2,(anon_class_24_2_357f297d *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)(f.lambda._M_value + 8));
  return;
}

Assistant:

void iSWAP< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_iSWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }